

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
               (AggregateFunctionSet *fun)

{
  AggregateFunction local_140;
  
  GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
            ();
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  return;
}

Assistant:

void AddGenericArgMinMaxFunction(AggregateFunctionSet &fun) {
	fun.AddFunction(GetGenericArgMinMaxFunction<OP>());
}